

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O0

Omega_h * __thiscall Omega_h::remove_trailing_whitespace_and_newlines(Omega_h *this,string *in)

{
  ulong uVar1;
  char *pcVar2;
  size_t i;
  size_t ri;
  size_t new_end;
  string *in_local;
  
  for (i = 0; uVar1 = std::__cxx11::string::size(), i < uVar1; i = i + 1) {
    std::__cxx11::string::size();
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in);
    if ((((*pcVar2 != ' ') &&
         (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in), *pcVar2 != '\t')) &&
        (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in), *pcVar2 != '\n')) &&
       (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in), *pcVar2 != '\r')) break;
  }
  std::__cxx11::string::substr((ulong)this,(ulong)in);
  return this;
}

Assistant:

static std::string remove_trailing_whitespace_and_newlines(
    std::string const& in) {
  std::size_t new_end = 0;
  for (std::size_t ri = 0; ri < in.size(); ++ri) {
    std::size_t i = in.size() - 1 - ri;
    if (in[i] != ' ' && in[i] != '\t' && in[i] != '\n' && in[i] != '\r') {
      new_end = i + 1;
      break;
    }
  }
  return in.substr(0, new_end);
}